

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LowerTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lowertriangular(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x528) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x528;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    LowerTriangularLayerParams::LowerTriangularLayerParams(this_00.lowertriangular_);
    (this->layer_).lowertriangular_ = (LowerTriangularLayerParams *)this_00;
  }
  return (LowerTriangularLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LowerTriangularLayerParams* NeuralNetworkLayer::mutable_lowertriangular() {
  if (!has_lowertriangular()) {
    clear_layer();
    set_has_lowertriangular();
    layer_.lowertriangular_ = new ::CoreML::Specification::LowerTriangularLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lowerTriangular)
  return layer_.lowertriangular_;
}